

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_lensshader.cpp
# Opt level: O0

void __thiscall FLensShader::Bind(FLensShader *this)

{
  bool bVar1;
  GLuint GVar2;
  FLensShader *this_local;
  
  bVar1 = FShaderProgram::operator_cast_to_bool(&this->mShader);
  if (!bVar1) {
    FShaderProgram::Compile(&this->mShader,Vertex,"shaders/glsl/screenquad.vp","",0x14a);
    FShaderProgram::Compile(&this->mShader,Fragment,"shaders/glsl/lensdistortion.fp","",0x14a);
    FShaderProgram::SetFragDataLocation(&this->mShader,0,"FragColor");
    FShaderProgram::Link(&this->mShader,"shaders/glsl/lensdistortion");
    FShaderProgram::SetAttribLocation(&this->mShader,0,"PositionInProjection");
    GVar2 = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniformSampler::Init(&this->InputTexture,GVar2,"InputTexture");
    GVar2 = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniform1f::Init(&this->AspectRatio,GVar2,"Aspect");
    GVar2 = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniform1f::Init(&this->Scale,GVar2,"Scale");
    GVar2 = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniform4f::Init(&this->LensDistortionCoefficient,GVar2,"k");
    GVar2 = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniform4f::Init(&this->CubicDistortionValue,GVar2,"kcube");
  }
  FShaderProgram::Bind(&this->mShader);
  return;
}

Assistant:

void FLensShader::Bind()
{
	if (!mShader)
	{
		mShader.Compile(FShaderProgram::Vertex, "shaders/glsl/screenquad.vp", "", 330);
		mShader.Compile(FShaderProgram::Fragment, "shaders/glsl/lensdistortion.fp", "", 330);
		mShader.SetFragDataLocation(0, "FragColor");
		mShader.Link("shaders/glsl/lensdistortion");
		mShader.SetAttribLocation(0, "PositionInProjection");
		InputTexture.Init(mShader, "InputTexture");
		AspectRatio.Init(mShader, "Aspect");
		Scale.Init(mShader, "Scale");
		LensDistortionCoefficient.Init(mShader, "k");
		CubicDistortionValue.Init(mShader, "kcube");
	}
	mShader.Bind();
}